

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t coda_strxspn(char *s,char *n,size_t len)

{
  char cVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar6 = s;
  if (0 < (long)len) {
    cVar1 = *n;
    pcVar5 = s;
    while (pcVar6 = s, cVar1 != '\0') {
      pp_Var2 = __ctype_tolower_loc();
      pcVar3 = n + 1;
      cVar4 = cVar1;
      while ((*pp_Var2)[*pcVar5] != (*pp_Var2)[cVar4]) {
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        pcVar6 = pcVar5;
        if (cVar4 == '\0') goto LAB_00105489;
      }
      pcVar5 = pcVar5 + 1;
      pcVar6 = pcVar5;
      if (s + len <= pcVar5) break;
    }
  }
LAB_00105489:
  return (long)pcVar6 - (long)s;
}

Assistant:

size_t coda_strxspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}